

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O1

void __thiscall
jrtplib::RTPExternalTransmitter::RTPExternalTransmitter
          (RTPExternalTransmitter *this,RTPMemoryManager *mgr)

{
  (this->super_RTPTransmitter).super_RTPMemoryObject.mgr = mgr;
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPMemoryObject_0013e098;
  timeinit = timeinit + 1;
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPExternalTransmitter_0013e4f8;
  (this->packetinjector).transmitter = this;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->rawpacketlist;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->rawpacketlist;
  (this->rawpacketlist).
  super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
  _M_node._M_size = 0;
  RTPAbortDescriptors::RTPAbortDescriptors(&this->m_abortDesc);
  this->init = false;
  this->created = false;
  return;
}

Assistant:

RTPExternalTransmitter::RTPExternalTransmitter(RTPMemoryManager *mgr) : RTPTransmitter(mgr), packetinjector((RTPExternalTransmitter *)this)
{
	created = false;
	init = false;
}